

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

bool __thiscall QCss::Parser::parseSimpleSelector(Parser *this,BasicSelector *basicSel)

{
  TokenType TVar1;
  Symbol *pSVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  QArrayData *pQVar8;
  long in_FS_OFFSET;
  bool bVar9;
  QLatin1String QVar10;
  Pseudo local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (long)this->index + -1;
  if ((lVar5 < (this->symbols).d.size) &&
     ((TVar1 = (this->symbols).d.ptr[lVar5].token, TVar1 == STAR || (TVar1 == IDENT)))) {
    bVar3 = parseElementName(this,&basicSel->elementName);
    bVar9 = false;
    uVar6 = 0;
    if (!bVar3) goto LAB_005e3f7b;
  }
  else {
    this->index = (int)lVar5;
    uVar6 = 1;
  }
  iVar4 = this->index;
  lVar5 = (long)iVar4;
  uVar7 = 0;
  if (lVar5 < (this->symbols).d.size) {
    uVar7 = 0;
    do {
      pSVar2 = (this->symbols).d.ptr;
      if (pSVar2[lVar5].token == HASH) {
        this->index = iVar4 + 1;
        local_78.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.type = (quint64)&DAT_aaaaaaaaaaaaaaaa;
        local_78.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        Symbol::lexem((QString *)&local_78,pSVar2 + (long)(iVar4 + 1) + -1);
        QString::remove((longlong)&local_78,0);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&basicSel->ids,(basicSel->ids).d.size,
                   (QString *)&local_78);
        QList<QString>::end(&basicSel->ids);
LAB_005e3e86:
        if ((QArrayData *)local_78.type != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78.type)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78.type)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          pQVar8 = (QArrayData *)local_78.type;
          if ((((QBasicAtomicInt *)local_78.type)->_q_value).super___atomic_base<int>._M_i == 0) {
LAB_005e3e9a:
            QArrayData::deallocate(pQVar8,2,0x10);
          }
        }
      }
      else {
        if ((this->symbols).d.ptr[lVar5].token == DOT) {
          this->index = iVar4 + 1;
          local_78.function.d.size._4_4_ = 0xaaaaaaaa;
          local_78.type = 0;
          local_78.name.d.d = (Data *)0x0;
          local_78.name.d.ptr = (char16_t *)0x0;
          local_78.name.d.size = 0;
          local_78.function.d.d = (Data *)0x0;
          local_78.function.d.ptr._0_1_ = 0;
          local_78.function.d.ptr._1_7_ = 0;
          local_78.function.d.size._0_4_ = 0;
          QVar10.m_data = "class";
          QVar10.m_size = 5;
          QString::operator=((QString *)&local_78,QVar10);
          local_78.function.d.size._0_4_ = 2;
          bVar3 = parseClass(this,(QString *)&local_78.name.d.size);
LAB_005e3e44:
          if (bVar3 != false) {
            QtPrivate::QMovableArrayOps<QCss::AttributeSelector>::
            emplace<QCss::AttributeSelector_const&>
                      ((QMovableArrayOps<QCss::AttributeSelector> *)&basicSel->attributeSelectors,
                       (basicSel->attributeSelectors).d.size,(AttributeSelector *)&local_78);
            QList<QCss::AttributeSelector>::end(&basicSel->attributeSelectors);
            if ((QArrayData *)local_78.name.d.size != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_78.name.d.size)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_78.name.d.size)->_q_value).super___atomic_base<int>.
                   _M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_78.name.d.size)->_q_value).super___atomic_base<int>.
                  _M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_78.name.d.size,2,0x10);
              }
            }
            goto LAB_005e3e86;
          }
          if ((QArrayData *)local_78.name.d.size != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78.name.d.size)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78.name.d.size)->_q_value).super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_78.name.d.size)->_q_value).super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate((QArrayData *)local_78.name.d.size,2,0x10);
            }
          }
          if ((QArrayData *)local_78.type != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_78.type)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_78.type)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            pQVar8 = (QArrayData *)local_78.type;
            if ((((QBasicAtomicInt *)local_78.type)->_q_value).super___atomic_base<int>._M_i == 0)
            goto LAB_005e4010;
          }
LAB_005e401f:
          bVar9 = false;
          goto LAB_005e3f7b;
        }
        if ((this->symbols).d.ptr[lVar5].token == LBRACKET) {
          this->index = iVar4 + 1;
          local_78.function.d.size._4_4_ = 0xaaaaaaaa;
          local_78.type = 0;
          local_78.name.d.d = (Data *)0x0;
          local_78.name.d.ptr = (char16_t *)0x0;
          local_78.name.d.size = 0;
          local_78.function.d.d = (Data *)0x0;
          local_78.function.d.ptr._0_1_ = 0;
          local_78.function.d.ptr._1_7_ = 0;
          local_78.function.d.size._0_4_ = 0;
          bVar3 = parseAttrib(this,(AttributeSelector *)&local_78);
          goto LAB_005e3e44;
        }
        if ((this->symbols).d.ptr[lVar5].token != COLON) break;
        this->index = iVar4 + 1;
        local_78._57_7_ = 0xaaaaaaaaaaaaaa;
        local_78.type = 0;
        local_78.name.d.d = (Data *)0x0;
        local_78.name.d.ptr = (char16_t *)0x0;
        local_78.name.d.size = 0;
        local_78.function.d.d = (Data *)0x0;
        local_78.function.d.ptr._0_1_ = 0;
        local_78.function.d.ptr._1_7_ = 0;
        local_78.function.d.size._0_4_ = 0;
        local_78.function.d.size._4_4_ = 0;
        local_78.negated = false;
        bVar3 = parsePseudo(this,&local_78);
        if (!bVar3) {
          if (&(local_78.function.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_78.function.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_78.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_78.function.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_78.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            pQVar8 = &(local_78.name.d.d)->super_QArrayData;
            if (((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                != 0) goto LAB_005e401f;
LAB_005e4010:
            QArrayData::deallocate(pQVar8,2,0x10);
          }
          goto LAB_005e401f;
        }
        QtPrivate::QMovableArrayOps<QCss::Pseudo>::emplace<QCss::Pseudo_const&>
                  ((QMovableArrayOps<QCss::Pseudo> *)&basicSel->pseudos,(basicSel->pseudos).d.size,
                   &local_78);
        QList<QCss::Pseudo>::end(&basicSel->pseudos);
        if (&(local_78.function.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_78.function.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_78.function.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_78.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          pQVar8 = &(local_78.name.d.d)->super_QArrayData;
          if (((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i !=
              0) goto LAB_005e3ea9;
          goto LAB_005e3e9a;
        }
      }
LAB_005e3ea9:
      uVar7 = uVar7 + 1;
      iVar4 = this->index;
      lVar5 = (long)iVar4;
    } while (lVar5 < (this->symbols).d.size);
  }
  bVar9 = uVar6 <= uVar7;
LAB_005e3f7b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool Parser::parseSimpleSelector(BasicSelector *basicSel)
{
    int minCount = 0;
    if (lookupElementName()) {
        if (!parseElementName(&basicSel->elementName)) return false;
    } else {
        prev();
        minCount = 1;
    }
    bool onceMore;
    int count = 0;
    do {
        onceMore = false;
        if (test(HASH)) {
            QString theid = lexem();
            // chop off leading #
            theid.remove(0, 1);
            basicSel->ids.append(theid);
            onceMore = true;
        } else if (testClass()) {
            onceMore = true;
            AttributeSelector a;
            a.name = "class"_L1;
            a.valueMatchCriterium = AttributeSelector::MatchIncludes;
            if (!parseClass(&a.value)) return false;
            basicSel->attributeSelectors.append(a);
        } else if (testAttrib()) {
            onceMore = true;
            AttributeSelector a;
            if (!parseAttrib(&a)) return false;
            basicSel->attributeSelectors.append(a);
        } else if (testPseudo()) {
            onceMore = true;
            Pseudo ps;
            if (!parsePseudo(&ps)) return false;
            basicSel->pseudos.append(ps);
        }
        if (onceMore) ++count;
    } while (onceMore);
    return count >= minCount;
}